

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  long *plVar1;
  sqlite3_module *psVar2;
  sqlite3_value *pVal;
  Mem *pMVar3;
  Fts5Storage *pFVar4;
  Fts5Config *pFVar5;
  ushort *puVar6;
  int *piVar7;
  u8 *a;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  uint uVar21;
  int iVar11;
  int iVar12;
  int iVar13;
  uchar *puVar14;
  i64 iDel;
  i64 iVar15;
  Fts5Structure *pFVar16;
  void *__s;
  Fts5Structure *pFVar17;
  char *pcVar18;
  Fts5Data *pFVar19;
  Fts5DlidxIter *pIter;
  u64 uVar20;
  Fts5Index *pFVar22;
  int iVar23;
  long lVar24;
  Fts5StructureLevel *pFVar25;
  long lVar26;
  ulong uVar27;
  Fts5Iter *pIter_00;
  int iVar28;
  int *piVar29;
  sqlite3_stmt *psVar30;
  bool bVar31;
  int local_13c;
  int *local_138;
  Fts5Index *local_130;
  i64 nRow;
  undefined8 uStack_120;
  int local_118;
  uint local_114;
  long local_110;
  Fts5Iter *local_108;
  int local_fc;
  int local_f8;
  int nKeep;
  ushort *local_f0;
  Fts5Structure *pNew;
  undefined8 uStack_e0;
  ulong local_d8;
  Fts5Termset *pFStack_d0;
  Fts5Config *local_c8;
  Fts5Data *local_c0;
  sqlite3_vtab *local_b8;
  int local_ac;
  Fts5Buffer poslist;
  sqlite3_stmt *pStmt;
  Fts5Buffer buf2;
  int nTerm;
  u32 local_68;
  int nIncr;
  ulong local_60;
  Fts5StructureLevel *local_58;
  long local_50;
  Fts5StructureLevel *local_48;
  long local_40;
  sqlite3_stmt *pScan;
  
  psVar2 = pVtab[1].pModule;
  local_13c = 0;
  psVar2->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)&pVtab->zErrMsg;
  local_130 = (Fts5Index *)pRowid;
  fts5TripCursors((Fts5FullTable *)pVtab);
  uVar21 = (*apVal)->flags & 0x3f;
  if (((0xaaaaaaaaaaaaaaaaU >> (ulong)uVar21 & 1) == 0) ||
     (pVal = apVal[(long)*(int *)&psVar2->xBestIndex + 2], uVar10._0_2_ = pVal->flags,
     uVar10._2_1_ = pVal->enc, uVar10._3_1_ = pVal->eSubtype,
     (0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar10 & 0x3f) & 1) != 0)) {
    if (*(int *)&psVar2->xFilter == 0) {
      bVar31 = *(char *)(*(long *)psVar2 + 0x66) == '\x05';
    }
    else {
      bVar31 = false;
    }
    if (((0x50505050UL >> (ulong)uVar21 & 1) == 0) || (*(int *)&(pVtab[1].pModule)->xFilter != 1)) {
      if (nArg == 1) {
        iVar15 = sqlite3VdbeIntValue(*apVal);
        iVar9 = sqlite3Fts5StorageDelete
                          ((Fts5Storage *)pVtab[1].zErrMsg,iVar15,(sqlite3_value **)0x0);
      }
      else {
        uVar10 = sqlite3_value_numeric_type(apVal[1]);
        if ((uVar10 & 0xfffffffb) == 1) {
          if ((0x50505050UL >> (sbyte)uVar21 & 1) == 0) {
            pFVar22 = local_130;
            if (bVar31 && uVar10 == 1) {
              iVar15 = sqlite3VdbeIntValue(apVal[1]);
              local_13c = sqlite3Fts5StorageDelete
                                    ((Fts5Storage *)pVtab[1].zErrMsg,iVar15,(sqlite3_value **)0x0);
              pFVar22 = local_130;
            }
          }
          else {
            iVar15 = sqlite3VdbeIntValue(*apVal);
            iDel = sqlite3VdbeIntValue(apVal[1]);
            pFVar22 = local_130;
            pFVar4 = (Fts5Storage *)pVtab[1].zErrMsg;
            if (iVar15 == iDel || uVar10 != 1) {
              local_13c = sqlite3Fts5StorageDelete(pFVar4,iVar15,(sqlite3_value **)0x0);
              pFVar22 = local_130;
            }
            else {
              if (!bVar31) {
                local_13c = sqlite3Fts5StorageContentInsert(pFVar4,apVal,(i64 *)local_130);
                iVar9 = local_13c;
                if ((local_13c == 0) &&
                   (local_13c = sqlite3Fts5StorageDelete
                                          ((Fts5Storage *)pVtab[1].zErrMsg,iVar15,
                                           (sqlite3_value **)0x0), iVar9 = local_13c, local_13c == 0
                   )) {
                  iVar9 = sqlite3Fts5StorageIndexInsert
                                    ((Fts5Storage *)pVtab[1].zErrMsg,apVal,(i64)pFVar22->pConfig);
                }
                goto LAB_001b16ac;
              }
              local_13c = sqlite3Fts5StorageDelete(pFVar4,iVar15,(sqlite3_value **)0x0);
              pFVar22 = local_130;
              if (local_13c == 0) {
                local_13c = sqlite3Fts5StorageDelete
                                      ((Fts5Storage *)pVtab[1].zErrMsg,iDel,(sqlite3_value **)0x0);
              }
            }
          }
          fts5StorageInsert(&local_13c,(Fts5FullTable *)pVtab,apVal,(i64 *)pFVar22);
          iVar9 = local_13c;
        }
        else {
          local_13c = 0x14;
          iVar9 = local_13c;
        }
      }
    }
    else {
      pcVar18 = "DELETE from";
      if (1 < nArg) {
        pcVar18 = "UPDATE";
      }
      pcVar18 = sqlite3_mprintf("cannot %s contentless fts5 table: %s",pcVar18,psVar2->xConnect);
      pVtab->zErrMsg = pcVar18;
      local_13c = 1;
      iVar9 = local_13c;
    }
    goto LAB_001b16ac;
  }
  puVar14 = sqlite3_value_text(pVal);
  if ((*(int *)&psVar2->xFilter != 0) &&
     (iVar9 = sqlite3_stricmp("delete",(char *)puVar14), iVar9 == 0)) {
    pMVar3 = apVal[1];
    uVar21._0_2_ = pMVar3->flags;
    uVar21._2_1_ = pMVar3->enc;
    uVar21._3_1_ = pMVar3->eSubtype;
    iVar9 = 0;
    if ((0x50505050UL >> ((ulong)uVar21 & 0x3f) & 1) != 0) {
      iVar15 = sqlite3VdbeIntValue(pMVar3);
      iVar9 = sqlite3Fts5StorageDelete((Fts5Storage *)pVtab[1].zErrMsg,iVar15,apVal + 2);
    }
    goto LAB_001b16ac;
  }
  pMVar3 = apVal[(long)*(int *)&psVar2->xBestIndex + 3];
  psVar2 = pVtab[1].pModule;
  local_ac = 0;
  iVar9 = sqlite3_stricmp("delete-all",(char *)puVar14);
  if (iVar9 == 0) {
    if (*(int *)&psVar2->xFilter != 0) {
      iVar9 = sqlite3Fts5StorageDeleteAll((Fts5Storage *)pVtab[1].zErrMsg);
      goto LAB_001b16ac;
    }
    pcVar18 = "\'delete-all\' may only be used with a contentless or external content fts5 table";
LAB_001b10ff:
    fts5SetVtabError((Fts5FullTable *)pVtab,pcVar18);
  }
  else {
    iVar9 = sqlite3_stricmp("rebuild",(char *)puVar14);
    local_b8 = pVtab;
    if (iVar9 == 0) {
      if (*(int *)&psVar2->xFilter != 1) {
        pFVar4 = (Fts5Storage *)pVtab[1].zErrMsg;
        pNew = (Fts5Structure *)0x0;
        uStack_e0 = 0;
        pFVar5 = pFVar4->pConfig;
        buf2.p = (u8 *)0x0;
        uStack_120 = 0;
        nRow = (i64)pFVar4;
        iVar9 = sqlite3Fts5StorageDeleteAll(pFVar4);
        if ((iVar9 == 0) && (iVar9 = fts5StorageLoadTotals(pFVar4,1), iVar9 == 0)) {
          iVar9 = fts5StorageGetStmt(pFVar4,10,(sqlite3_stmt **)&buf2,(char **)0x0);
          psVar30 = (sqlite3_stmt *)buf2.p;
        }
        else {
          psVar30 = (sqlite3_stmt *)0x0;
        }
LAB_001b1165:
        do {
          if ((iVar9 != 0) || (iVar11 = sqlite3_step(psVar30), iVar11 != 100)) goto LAB_001b128a;
          uVar21 = 0;
          local_130 = (Fts5Index *)sqlite3_column_int64(psVar30,0);
          uStack_e0 = uStack_e0 & 0xffffffff00000000;
          iVar9 = sqlite3Fts5IndexBeginWrite(pFVar4->pIndex,0,(i64)local_130);
          poslist.p = (u8 *)CONCAT44(poslist.p._4_4_,iVar9);
          while( true ) {
            uStack_120 = CONCAT44(uStack_120._4_4_,uVar21);
            if (iVar9 != 0) break;
            if (pFVar5->nCol <= (int)uVar21) {
              pFVar4->nTotalRow = pFVar4->nTotalRow + 1;
              iVar9 = fts5StorageInsertDocsize(pFVar4,(i64)local_130,(Fts5Buffer *)&pNew);
              poslist.p = (u8 *)CONCAT44(poslist.p._4_4_,iVar9);
              goto LAB_001b1165;
            }
            uStack_120 = (ulong)uVar21;
            if (pFVar5->abUnindexed[(int)uVar21] == '\0') {
              puVar14 = sqlite3_column_text(psVar30,uVar21 + 1);
              iVar9 = sqlite3_column_bytes(psVar30,(int)uStack_120 + 1);
              if (puVar14 == (uchar *)0x0) {
                iVar9 = 0;
              }
              else {
                iVar9 = (*pFVar5->pTokApi->xTokenize)
                                  (pFVar5->pTok,&nRow,4,(char *)puVar14,iVar9,
                                   fts5StorageInsertCallback);
              }
              poslist.p = (u8 *)CONCAT44(poslist.p._4_4_,iVar9);
              iVar15 = (i64)uStack_120._4_4_;
            }
            else {
              iVar15 = 0;
            }
            sqlite3Fts5BufferAppendVarint((int *)&poslist,(Fts5Buffer *)&pNew,iVar15);
            pFVar4->aTotalSize[(int)uStack_120] =
                 pFVar4->aTotalSize[(int)uStack_120] + (long)uStack_120._4_4_;
            uVar21 = (int)uStack_120 + 1;
            iVar9 = (int)poslist.p;
          }
          pFVar4->nTotalRow = pFVar4->nTotalRow + 1;
        } while( true );
      }
      pcVar18 = "\'rebuild\' may not be used with a contentless fts5 table";
      goto LAB_001b10ff;
    }
    iVar9 = sqlite3_stricmp("optimize",(char *)puVar14);
    if (iVar9 == 0) {
      pFVar22 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
      pNew = (Fts5Structure *)0x0;
      fts5IndexFlush(pFVar22);
      pFVar17 = fts5StructureRead(pFVar22);
      fts5StructureInvalidate(pFVar22);
      if (pFVar17 == (Fts5Structure *)0x0) {
        pFVar16 = (Fts5Structure *)0x0;
      }
      else {
        pFVar16 = fts5IndexOptimizeStruct(pFVar22,pFVar17);
        pNew = pFVar16;
      }
      fts5StructureRelease(pFVar17);
      if (pFVar16 != (Fts5Structure *)0x0) {
        iVar9 = -1;
        lVar24 = 0x1c;
        do {
          lVar26 = lVar24;
          iVar9 = iVar9 + 1;
          lVar24 = lVar26 + 0x10;
        } while (*(int *)((long)pFVar16->aLevel + lVar26 + -0x18) == 0);
        while ((pFVar22->rc == 0 && (0 < *(int *)((long)pFVar16->aLevel + lVar26 + -0x18)))) {
          nRow = CONCAT44(nRow._4_4_,1000);
          fts5IndexMergeLevel(pFVar22,&pNew,iVar9,(int *)&nRow);
          pFVar16 = pNew;
        }
        fts5StructureWrite(pFVar22,pFVar16);
        fts5StructureRelease(pFVar16);
        pVtab = local_b8;
      }
LAB_001b16a1:
      iVar9 = pFVar22->rc;
      pFVar22->rc = 0;
      goto LAB_001b16ac;
    }
    iVar9 = sqlite3_stricmp("merge",(char *)puVar14);
    if (iVar9 == 0) {
      iVar15 = sqlite3VdbeIntValue(pMVar3);
      iVar9 = (int)iVar15;
      pFVar22 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
      pFVar17 = fts5StructureRead(pFVar22);
      if (pFVar17 == (Fts5Structure *)0x0) goto LAB_001b16a1;
      iVar11 = pFVar22->pConfig->nUsermerge;
      pNew = pFVar17;
      fts5StructureInvalidate(pFVar22);
      if (iVar9 < 0) {
        pFVar16 = fts5IndexOptimizeStruct(pFVar22,pFVar17);
        fts5StructureRelease(pFVar17);
        pNew = pFVar16;
        if (pFVar16 != (Fts5Structure *)0x0) {
          iVar11 = 2;
          iVar9 = -iVar9;
          pFVar17 = pFVar16;
          goto LAB_001b1376;
        }
        pFVar17 = (Fts5Structure *)0x0;
      }
      else {
LAB_001b1376:
        if ((pFVar17->nLevel != 0) &&
           (iVar9 = fts5IndexMerge(pFVar22,&pNew,iVar9,iVar11), pFVar17 = pNew, iVar9 != 0)) {
          fts5StructureWrite(pFVar22,pNew);
        }
      }
      fts5StructureRelease(pFVar17);
      goto LAB_001b16a1;
    }
    iVar9 = sqlite3_stricmp("integrity-check",(char *)puVar14);
    if (iVar9 == 0) {
      pFVar4 = (Fts5Storage *)pVtab[1].zErrMsg;
      pFVar5 = pFVar4->pConfig;
      pNew = (Fts5Structure *)0x0;
      uStack_e0 = 0;
      local_d8 = 0;
      pFStack_d0 = (Fts5Termset *)0x0;
      local_c8 = pFVar5;
      __s = sqlite3_malloc64((long)pFVar5->nCol * 0xc);
      if (__s == (void *)0x0) {
        pVtab = local_b8;
        iVar9 = 7;
      }
      else {
        iVar11 = pFVar5->nCol;
        memset(__s,0,(long)iVar11 * 8);
        iVar9 = fts5StorageGetStmt(pFVar4,10,&pScan,(char **)0x0);
        if (iVar9 == 0) {
          local_130 = (Fts5Index *)((long)__s + (long)iVar11 * 8);
          while (iVar9 = sqlite3_step(pScan), iVar9 == 100) {
            pNew = (Fts5Structure *)sqlite3_column_int64(pScan,0);
            uStack_e0 = uStack_e0 & 0xffffffff;
            if (((pFVar5->bColumnsize == 0) ||
                (iVar9 = sqlite3Fts5StorageDocsize(pFVar4,(i64)pNew,(int *)local_130), iVar9 == 0))
               && (iVar9 = 0, pFVar5->eDetail == 1)) {
              iVar9 = sqlite3Fts5TermsetNew(&pFStack_d0);
            }
            uVar27 = 0;
            while( true ) {
              if (iVar9 != 0) {
                sqlite3Fts5TermsetFree(pFStack_d0);
                pFStack_d0 = (Fts5Termset *)0x0;
                goto LAB_001b1670;
              }
              if ((long)pFVar5->nCol <= (long)uVar27) break;
              iVar9 = 0;
              if (pFVar5->abUnindexed[uVar27] == '\0') {
                uStack_e0 = uVar27 & 0xffffffff;
                if ((pFVar5->eDetail != 2) ||
                   (iVar9 = sqlite3Fts5TermsetNew(&pFStack_d0), iVar9 == 0)) {
                  iVar9 = (int)uVar27 + 1;
                  puVar14 = sqlite3_column_text(pScan,iVar9);
                  iVar9 = sqlite3_column_bytes(pScan,iVar9);
                  if ((puVar14 == (uchar *)0x0) ||
                     (iVar9 = (*pFVar5->pTokApi->xTokenize)
                                        (pFVar5->pTok,&pNew,4,(char *)puVar14,iVar9,
                                         fts5StorageIntegrityCallback), iVar9 == 0)) {
                    if (pFVar5->bColumnsize == 0) {
                      iVar9 = 0;
                    }
                    else {
                      iVar9 = 0x10b;
                      if (uStack_e0._4_4_ == *(int *)((long)&local_130->pConfig + uVar27 * 4)) {
                        iVar9 = 0;
                      }
                    }
                  }
                }
                plVar1 = (long *)((long)__s + uVar27 * 8);
                *plVar1 = *plVar1 + (long)uStack_e0._4_4_;
                if (pFVar5->eDetail == 2) {
                  sqlite3Fts5TermsetFree(pFStack_d0);
                  pFStack_d0 = (Fts5Termset *)0x0;
                }
              }
              uVar27 = uVar27 + 1;
            }
            sqlite3Fts5TermsetFree(pFStack_d0);
            pFStack_d0 = (Fts5Termset *)0x0;
          }
          iVar9 = 0;
LAB_001b1670:
          iVar11 = sqlite3_reset(pScan);
          if ((iVar9 == 0) && (iVar9 = iVar11, iVar11 == 0)) {
            lVar24 = 0;
            iVar9 = fts5StorageLoadTotals(pFVar4,0);
LAB_001b16e4:
            if (iVar9 == 0) {
              if (lVar24 < pFVar5->nCol) goto code_r0x001b16f1;
              if (pFVar5->eContent == 0) {
                nRow = 0;
                iVar9 = fts5StorageCount(pFVar4,"content",&nRow);
                if ((iVar9 != 0) || (iVar9 = 0x10b, nRow != pFVar4->nTotalRow)) goto LAB_001b1684;
              }
              if (pFVar5->bColumnsize != 0) {
                nRow = 0;
                iVar9 = fts5StorageCount(pFVar4,"docsize",&nRow);
                if ((iVar9 != 0) || (iVar9 = 0x10b, nRow != pFVar4->nTotalRow)) goto LAB_001b1684;
              }
              pFVar22 = pFVar4->pIndex;
              local_60 = local_d8;
              iVar9 = pFVar22->pConfig->eDetail;
              poslist.p = (u8 *)0x0;
              poslist.n = 0;
              poslist.nSpace = 0;
              pFVar17 = fts5StructureRead(pFVar22);
              if (pFVar17 != (Fts5Structure *)0x0) {
                local_58 = pFVar17->aLevel;
                local_138 = &pFVar22->rc;
                lVar24 = 0;
                local_130 = pFVar22;
                while (lVar24 < pFVar17->nLevel) {
                  pFVar25 = local_58 + lVar24;
                  local_50 = lVar24;
                  local_48 = pFVar25;
                  for (lVar26 = 0; lVar26 < pFVar25->nSeg; lVar26 = lVar26 + 1) {
                    pStmt = (sqlite3_stmt *)0x0;
                    iVar11 = pFVar25->aSeg[lVar26].pgnoFirst;
                    if (iVar11 != 0) {
                      local_108 = (Fts5Iter *)(pFVar25->aSeg + lVar26);
                      uVar27 = (ulong)*(uint *)&(local_108->base).pData;
                      local_fc = iVar11 + -1;
                      local_40 = lVar26;
                      pcVar18 = sqlite3_mprintf("SELECT segid, term, (pgno>>1), (pgno&1) FROM %Q.\'%q_idx\' WHERE segid=%d"
                                                ,pFVar22->pConfig->zDb,pFVar22->pConfig->zName,
                                                (ulong)(uint)(local_108->base).iRowid);
                      fts5IndexPrepareStmt(pFVar22,&pStmt,pcVar18);
                      psVar30 = pStmt;
                      while( true ) {
                        do {
                          if ((*local_138 != 0) || (iVar11 = sqlite3_step(psVar30), iVar11 != 100))
                          goto LAB_001b1d57;
                          iVar11 = sqlite3_column_bytes(psVar30,1);
                          puVar14 = sqlite3_column_text(psVar30,1);
                          iVar12 = sqlite3_column_int(psVar30,2);
                          iVar13 = sqlite3_column_int(psVar30,3);
                        } while (iVar12 < *(int *)((long)&(local_108->base).iRowid + 4));
                        local_118 = iVar12;
                        pFVar19 = fts5LeafRead(local_130,
                                               (long)iVar12 +
                                               ((ulong)(uint)(local_108->base).iRowid << 0x25));
                        if (pFVar19 == (Fts5Data *)0x0) break;
                        if (pFVar19->szLeaf < pFVar19->nn) {
                          local_114 = fts5LeafFirstTermOff(pFVar19);
                          puVar6 = (ushort *)pFVar19->p;
                          iVar12 = pFVar19->szLeaf;
                          local_c0 = pFVar19;
                          if ((int)local_114 < iVar12 &&
                              (int)(uint)(ushort)(*puVar6 << 8 | *puVar6 >> 8) < (int)local_114) {
                            local_110 = CONCAT44(local_110._4_4_,iVar12);
                            local_f0 = puVar6;
                            iVar12 = sqlite3Fts5GetVarint32
                                               ((uchar *)((ulong)local_114 + (long)puVar6),
                                                (u32 *)&nTerm);
                            iVar28 = nTerm - iVar11;
                            if (nTerm < iVar11) {
                              iVar11 = nTerm;
                            }
                            if ((iVar11 != 0) &&
                               (iVar11 = memcmp((void *)((long)local_f0 +
                                                        (ulong)(iVar12 + local_114)),puVar14,
                                                (long)iVar11), iVar11 != 0)) {
                              iVar28 = iVar11;
                            }
                            iVar12 = (int)local_110;
                            if (iVar28 < 0) goto LAB_001b19aa;
                          }
                          else {
LAB_001b19aa:
                            *local_138 = 0x10b;
                          }
                          nRow = 0;
                          uStack_120._0_4_ = 0;
                          uStack_120._4_4_ = 0;
                          buf2.p = (u8 *)0x0;
                          buf2.n = 0;
                          buf2.nSpace = 0;
                          local_114 = 0;
                          lVar24 = 0;
                          pFVar19 = local_c0;
                          while ((iVar12 < pFVar19->nn && (*local_138 == 0))) {
                            iVar28 = (int)lVar24;
                            local_f0 = (ushort *)pFVar19->p;
                            local_110 = CONCAT44(local_110._4_4_,iVar12);
                            iVar12 = sqlite3Fts5GetVarint32
                                               ((uchar *)((long)iVar12 + (long)local_f0),
                                                (u32 *)&nIncr);
                            puVar6 = local_f0;
                            lVar24 = (long)iVar28 + (long)nIncr;
                            iVar11 = pFVar19->szLeaf;
                            iVar23 = (int)lVar24;
                            if (iVar23 < iVar11) {
                              local_f8 = iVar12;
                              if (iVar28 == 0) {
                                iVar12 = sqlite3Fts5GetVarint32
                                                   ((uchar *)(lVar24 + (long)local_f0),(u32 *)&nKeep
                                                   );
                                piVar29 = local_138;
                                if (iVar11 < iVar12 + iVar23 + nKeep) {
                                  *local_138 = 0x10b;
                                }
                                else {
                                  sqlite3Fts5BufferSet
                                            (local_138,(Fts5Buffer *)&nRow,nKeep,
                                             (u8 *)((long)puVar6 + (long)(iVar12 + iVar23)));
                                }
                              }
                              else {
                                iVar12 = sqlite3Fts5GetVarint32
                                                   ((uchar *)((long)iVar23 + (long)local_f0),
                                                    (u32 *)&nKeep);
                                iVar28 = sqlite3Fts5GetVarint32
                                                   ((uchar *)((long)(iVar12 + iVar23) +
                                                             (long)local_f0),&local_68);
                                piVar7 = local_138;
                                if ((nKeep <= (int)local_114) &&
                                   (iVar28 = iVar12 + iVar23 + iVar28,
                                   (int)(local_68 + iVar28) <= iVar11)) {
                                  uStack_120._0_4_ = nKeep;
                                  sqlite3Fts5BufferAppendBlob
                                            (local_138,(Fts5Buffer *)&nRow,local_68,
                                             (u8 *)((long)local_f0 + (long)iVar28));
                                  piVar29 = local_138;
                                  if ((*piVar7 != 0) ||
                                     (iVar11 = fts5BufferCompare((Fts5Buffer *)&nRow,&buf2),
                                     piVar29 = local_138, 0 < iVar11)) goto LAB_001b1aef;
                                }
                                *local_138 = 0x10b;
                                piVar29 = local_138;
                              }
LAB_001b1aef:
                              iVar12 = local_f8;
                            }
                            else {
                              *local_138 = 0x10b;
                              piVar29 = local_138;
                            }
                            pFVar19 = local_c0;
                            iVar12 = (int)local_110 + iVar12;
                            local_114 = (int)uStack_120;
                            sqlite3Fts5BufferSet(piVar29,&buf2,(int)uStack_120,(u8 *)nRow);
                          }
                          sqlite3Fts5BufferFree((Fts5Buffer *)&nRow);
                          sqlite3Fts5BufferFree(&buf2);
                        }
                        else {
                          *local_138 = 0x10b;
                        }
                        piVar29 = local_138;
                        sqlite3_free(pFVar19);
                        if (*piVar29 != 0) break;
                        iVar12 = local_118 + -1;
                        iVar11 = 0;
                        for (lVar24 = (long)(local_fc + 1);
                            (iVar28 = local_118, iVar11 == 0 && (lVar24 <= iVar12));
                            lVar24 = lVar24 + 1) {
                          pFVar19 = fts5DataRead(local_130,
                                                 ((ulong)(uint)(local_108->base).iRowid << 0x25) +
                                                 lVar24);
                          if (pFVar19 != (Fts5Data *)0x0) {
                            if (pFVar19->szLeaf < pFVar19->nn) {
                              *local_138 = 0x10b;
                            }
                            if (((int)uVar27 + 1 <= lVar24) &&
                               (pFVar19->p[1] != '\0' || *pFVar19->p != '\0')) {
                              *local_138 = 0x10b;
                            }
                          }
                          sqlite3_free(pFVar19);
                          iVar11 = *local_138;
                        }
                        if (iVar11 != 0) break;
                        if (iVar13 == 0) {
                          uVar27 = (ulong)*(uint *)&(local_108->base).pData;
                          local_fc = local_118;
                        }
                        else {
                          uVar21 = (uint)(local_108->base).iRowid;
                          uVar27 = 0;
                          pIter = fts5DlidxIterInit(local_130,0,uVar21,local_118);
                          lVar24 = (ulong)uVar21 << 0x25;
                          while ((piVar29 = local_138, *local_138 == 0 && (pIter->aLvl[0].bEof == 0)
                                 )) {
                            uVar27 = (ulong)iVar28;
                            while( true ) {
                              uVar27 = uVar27 + 1;
                              iVar28 = pIter->aLvl[0].iLeafPgno;
                              if ((long)iVar28 <= (long)uVar27) break;
                              pFVar19 = fts5DataRead(local_130,lVar24 + uVar27);
                              if (pFVar19 != (Fts5Data *)0x0) {
                                if (pFVar19->p[1] != '\0' || *pFVar19->p != '\0') {
                                  *piVar29 = 0x10b;
                                }
                                sqlite3_free(pFVar19);
                              }
                            }
                            pFVar19 = fts5DataRead(local_130,iVar28 + lVar24);
                            if (pFVar19 != (Fts5Data *)0x0) {
                              uVar8 = *(ushort *)pFVar19->p;
                              uVar8 = uVar8 << 8 | uVar8 >> 8;
                              if ((pFVar19->szLeaf <= (int)(uint)uVar8) ||
                                 (sqlite3Fts5GetVarint
                                            ((uchar *)((long)pFVar19->p + (ulong)uVar8),(u64 *)&nRow
                                            ), nRow != pIter->aLvl[0].iRowid)) {
                                *local_138 = 0x10b;
                              }
                              sqlite3_free(pFVar19);
                            }
                            fts5DlidxIterNext(local_130,pIter);
                          }
                          fts5DlidxIterFree(pIter);
                          local_fc = local_118;
                        }
                      }
LAB_001b1d57:
                      iVar11 = sqlite3_finalize(psVar30);
                      pFVar25 = local_48;
                      lVar26 = local_40;
                      pFVar22 = local_130;
                      if (*local_138 == 0) {
                        *local_138 = iVar11;
                      }
                    }
                  }
                  lVar24 = local_50 + 1;
                }
              }
              uVar27 = 0;
              fts5MultiIterNew(pFVar22,pFVar17,0x20,(Fts5Colset *)0x0,(u8 *)0x0,0,-1,0,
                               (Fts5Iter **)&nRow);
              lVar24 = nRow + 0x60;
              local_108 = (Fts5Iter *)nRow;
              pIter_00 = (Fts5Iter *)nRow;
              local_110 = lVar24;
              while ((pFVar22->rc == 0 && ((pIter_00->base).bEof == '\0'))) {
                buf2.p = (u8 *)0x0;
                pStmt = (sqlite3_stmt *)((ulong)pStmt & 0xffffffff00000000);
                lVar26 = (ulong)pIter_00->aFirst[1].iFirst * 0x78;
                iVar15 = *(i64 *)(lVar24 + 0x68 + lVar26);
                local_138 = (int *)CONCAT44(local_138._4_4_,*(undefined4 *)(lVar24 + 0x60 + lVar26))
                ;
                pcVar18 = *(char **)(lVar24 + 0x58 + lVar26);
                if (iVar9 == 1) {
                  iVar11 = fts5MultiIterIsEmpty(pFVar22,pIter_00);
                  if (iVar11 == 0) {
                    uVar20 = sqlite3Fts5IndexEntryCksum(iVar15,0,0,-1,pcVar18,(int)local_138);
                    uVar27 = uVar27 ^ uVar20;
                  }
                }
                else {
                  poslist._8_8_ = poslist._8_8_ & 0xffffffff00000000;
                  fts5SegiterPoslist(pFVar22,(Fts5SegIter *)(lVar26 + lVar24),(Fts5Colset *)0x0,
                                     &poslist);
                  a = poslist.p;
                  iVar11 = poslist.n;
                  while (iVar12 = sqlite3Fts5PoslistNext64(a,iVar11,(int *)&pStmt,(i64 *)&buf2),
                        pIter_00 = local_108, lVar24 = local_110, iVar12 == 0) {
                    uVar20 = sqlite3Fts5IndexEntryCksum
                                       (iVar15,(int)((ulong)buf2.p >> 0x20),
                                        (uint)buf2.p & 0x7fffffff,-1,pcVar18,(int)local_138);
                    uVar27 = uVar27 ^ uVar20;
                  }
                }
                fts5MultiIterNext(pFVar22,pIter_00,0,0);
              }
              fts5MultiIterFree(pIter_00);
              if ((pFVar22->rc == 0) && (uVar27 != local_60)) {
                pFVar22->rc = 0x10b;
              }
              fts5StructureRelease(pFVar17);
              sqlite3Fts5BufferFree(&poslist);
              iVar9 = pFVar22->rc;
              pFVar22->rc = 0;
            }
          }
        }
LAB_001b1684:
        sqlite3_free(__s);
        pVtab = local_b8;
      }
      goto LAB_001b16ac;
    }
    iVar9 = sqlite3Fts5IndexLoadConfig(*(Fts5Index **)&pVtab[1].nRef);
    if ((iVar9 != 0) ||
       (iVar9 = sqlite3Fts5ConfigSetValue
                          ((Fts5Config *)pVtab[1].pModule,(char *)puVar14,pMVar3,&local_ac),
       iVar9 != 0)) goto LAB_001b16ac;
    if (local_ac == 0) {
      iVar9 = sqlite3Fts5StorageConfigValue
                        ((Fts5Storage *)pVtab[1].zErrMsg,(char *)puVar14,pMVar3,0);
      goto LAB_001b16ac;
    }
  }
  iVar9 = 1;
LAB_001b16ac:
  local_13c = iVar9;
  (pVtab[1].pModule)->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)0x0;
  return local_13c;
LAB_001b128a:
  sqlite3_free(pNew);
  iVar11 = sqlite3_reset(psVar30);
  pVtab = local_b8;
  if ((iVar9 == 0) && (iVar9 = iVar11, iVar11 == 0)) {
    iVar9 = fts5StorageSaveTotals(pFVar4);
    pVtab = local_b8;
  }
  goto LAB_001b16ac;
code_r0x001b16f1:
  iVar9 = 0;
  if (pFVar4->aTotalSize[lVar24] != *(long *)((long)__s + lVar24 * 8)) {
    iVar9 = 0x10b;
  }
  lVar24 = lVar24 + 1;
  goto LAB_001b16e4;
}

Assistant:

static int fts5UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  Fts5Config *pConfig = pTab->p.pConfig;
  int eType0;                     /* value_type() of apVal[0] */
  int rc = SQLITE_OK;             /* Return code */

  /* A transaction must be open when this is called. */
  assert( pTab->ts.eState==1 );

  assert( pVtab->zErrMsg==0 );
  assert( nArg==1 || nArg==(2+pConfig->nCol+2) );
  assert( sqlite3_value_type(apVal[0])==SQLITE_INTEGER 
       || sqlite3_value_type(apVal[0])==SQLITE_NULL 
  );
  assert( pTab->p.pConfig->pzErrmsg==0 );
  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Put any active cursors into REQUIRE_SEEK state. */
  fts5TripCursors(pTab);

  eType0 = sqlite3_value_type(apVal[0]);
  if( eType0==SQLITE_NULL 
   && sqlite3_value_type(apVal[2+pConfig->nCol])!=SQLITE_NULL 
  ){
    /* A "special" INSERT op. These are handled separately. */
    const char *z = (const char*)sqlite3_value_text(apVal[2+pConfig->nCol]);
    if( pConfig->eContent!=FTS5_CONTENT_NORMAL 
      && 0==sqlite3_stricmp("delete", z) 
    ){
      rc = fts5SpecialDelete(pTab, apVal);
    }else{
      rc = fts5SpecialInsert(pTab, z, apVal[2 + pConfig->nCol + 1]);
    }
  }else{
    /* A regular INSERT, UPDATE or DELETE statement. The trick here is that
    ** any conflict on the rowid value must be detected before any 
    ** modifications are made to the database file. There are 4 cases:
    **
    **   1) DELETE
    **   2) UPDATE (rowid not modified)
    **   3) UPDATE (rowid modified)
    **   4) INSERT
    **
    ** Cases 3 and 4 may violate the rowid constraint.
    */
    int eConflict = SQLITE_ABORT;
    if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
      eConflict = sqlite3_vtab_on_conflict(pConfig->db);
    }

    assert( eType0==SQLITE_INTEGER || eType0==SQLITE_NULL );
    assert( nArg!=1 || eType0==SQLITE_INTEGER );

    /* Filter out attempts to run UPDATE or DELETE on contentless tables.
    ** This is not suported.  */
    if( eType0==SQLITE_INTEGER && fts5IsContentless(pTab) ){
      pTab->p.base.zErrMsg = sqlite3_mprintf(
          "cannot %s contentless fts5 table: %s", 
          (nArg>1 ? "UPDATE" : "DELETE from"), pConfig->zName
      );
      rc = SQLITE_ERROR;
    }

    /* DELETE */
    else if( nArg==1 ){
      i64 iDel = sqlite3_value_int64(apVal[0]);  /* Rowid to delete */
      rc = sqlite3Fts5StorageDelete(pTab->pStorage, iDel, 0);
    }

    /* INSERT or UPDATE */
    else{
      int eType1 = sqlite3_value_numeric_type(apVal[1]);

      if( eType1!=SQLITE_INTEGER && eType1!=SQLITE_NULL ){
        rc = SQLITE_MISMATCH;
      }

      else if( eType0!=SQLITE_INTEGER ){     
        /* If this is a REPLACE, first remove the current entry (if any) */
        if( eConflict==SQLITE_REPLACE && eType1==SQLITE_INTEGER ){
          i64 iNew = sqlite3_value_int64(apVal[1]);  /* Rowid to delete */
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
        }
        fts5StorageInsert(&rc, pTab, apVal, pRowid);
      }

      /* UPDATE */
      else{
        i64 iOld = sqlite3_value_int64(apVal[0]);  /* Old rowid */
        i64 iNew = sqlite3_value_int64(apVal[1]);  /* New rowid */
        if( eType1==SQLITE_INTEGER && iOld!=iNew ){
          if( eConflict==SQLITE_REPLACE ){
            rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
            }
            fts5StorageInsert(&rc, pTab, apVal, pRowid);
          }else{
            rc = sqlite3Fts5StorageContentInsert(pTab->pStorage, apVal, pRowid);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageIndexInsert(pTab->pStorage, apVal,*pRowid);
            }
          }
        }else{
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
          fts5StorageInsert(&rc, pTab, apVal, pRowid);
        }
      }
    }
  }

  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}